

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7_arr_func_3.cpp
# Opt level: O0

int fill_array(double *ar,int limit)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  int local_24;
  double dStack_20;
  int i;
  double temp;
  double *pdStack_10;
  int limit_local;
  double *ar_local;
  
  local_24 = 0;
  temp._4_4_ = limit;
  pdStack_10 = ar;
  while( true ) {
    if (temp._4_4_ <= local_24) {
      return local_24;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Enter value # ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24 + 1);
    std::operator<<(poVar2,":");
    std::istream::operator>>(&std::cin,&stack0xffffffffffffffe0);
    uVar3 = std::ios::operator!((ios *)((long)&std::cin + *(long *)(std::cin + -0x18)));
    if ((uVar3 & 1) != 0) break;
    if (dStack_20 < 0.0) {
      return local_24;
    }
    pdStack_10[local_24] = dStack_20;
    local_24 = local_24 + 1;
  }
  std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
  do {
    iVar1 = std::istream::get();
  } while (iVar1 != 10);
  std::operator<<((ostream *)&std::cout,"Bad input; input process terminated.\n");
  return local_24;
}

Assistant:

int fill_array (double ar[], int limit)
{
    using namespace std;
    double temp;
    int i;
    for (i = 0; i < limit; i++)
    {
        cout << "Enter value # " << (i + 1) << ":";
        cin >> temp;
        if (!cin) {
            cin.clear();
            //  if \n, just skip
            while(cin.get() != '\n')
            {
                continue;
            }
            cout << "Bad input; input process terminated.\n";
            break;
        }
        else if (temp < 0)
        {
            // if value is less than 0
            break;
        }
        //  write into array
        ar[i] = temp;
    }

    //  return the actual input numbers
    return i;
}